

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

int __thiscall cmCTestSubmitHandler::ProcessHandler(cmCTestSubmitHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  string *file_00;
  string *typeString;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  reference pbVar7;
  string local_18a8 [32];
  undefined1 local_1888 [8];
  ostringstream cmCTestLog_msg_10;
  string local_1710 [32];
  undefined1 local_16f0 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1578 [32];
  undefined1 local_1558 [8];
  ostringstream cmCTestLog_msg_8;
  string local_13e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a0;
  string local_1380 [32];
  undefined1 local_1360 [8];
  ostringstream cmCTestLog_msg_7;
  undefined1 local_11e8 [8];
  string url;
  undefined1 local_11a8 [8];
  ostringstream cmCTestLog_msg_6;
  char *specificGroup;
  undefined1 local_1008 [8];
  ostringstream cmCTestLog_msg_5;
  string *file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int cnt;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e60;
  const_iterator local_e58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e48;
  const_iterator local_e40;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e30;
  difference_type local_e28;
  size_t endPos;
  Part p;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0;
  allocator<char> local_d79;
  string local_d78;
  string local_d58 [32];
  undefined1 local_d38 [8];
  ostringstream cmCTestLog_msg_4;
  string local_bc0 [32];
  undefined1 local_ba0 [8];
  ostringstream cmCTestLog_msg_3;
  string local_a28 [32];
  reference local_a08;
  string *gfile;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_9c8 [8];
  ostringstream cmCTestLog_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  long local_830;
  size_type glen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  undefined1 local_7e8 [8];
  string gpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gfiles;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  undefined1 local_6e8 [8];
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmGeneratedFileStream ofs;
  undefined1 local_428 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_2a9;
  undefined1 local_2a8 [8];
  string type;
  char *proxy_type;
  char *proxy;
  string local_270 [32];
  undefined1 local_250 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string *local_90;
  string *buildDirectory;
  string local_80;
  cmValue local_60;
  cmValue cdashUploadType;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue cdashUploadFile;
  cmCTestSubmitHandler *this_local;
  
  cdashUploadFile.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CDashUploadFile",&local_41);
  local_20 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CDashUploadType",(allocator<char> *)((long)&buildDirectory + 7));
  local_60 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&buildDirectory + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_20);
  if ((bVar2) && (bVar2 = cmValue::operator_cast_to_bool(&local_60), bVar2)) {
    file_00 = cmValue::operator*[abi_cxx11_(&local_20);
    typeString = cmValue::operator*[abi_cxx11_(&local_60);
    this_local._4_4_ = HandleCDashUploadFile(this,file_00,typeString);
  }
  else {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"BuildDirectory",&local_d1);
    cmCTest::GetCTestConfiguration(&local_b0,pcVar1,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    local_90 = &local_b0;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = getenv("HTTP_PROXY");
      if (pcVar4 != (char *)0x0) {
        this->HTTPProxyType = 1;
        std::__cxx11::string::operator=((string *)&this->HTTPProxy,pcVar4);
        pcVar4 = getenv("HTTP_PROXY_PORT");
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::operator+=((string *)&this->HTTPProxy,":");
          pcVar4 = getenv("HTTP_PROXY_PORT");
          std::__cxx11::string::operator+=((string *)&this->HTTPProxy,pcVar4);
        }
        pcVar4 = getenv("HTTP_PROXY_TYPE");
        type.field_2._8_8_ = pcVar4;
        if (pcVar4 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_2a8,pcVar4,&local_2a9);
          std::allocator<char>::~allocator(&local_2a9);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2a8,"HTTP");
          if (bVar2) {
            this->HTTPProxyType = 1;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2a8,"SOCKS4");
            if (bVar2) {
              this->HTTPProxyType = 2;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_2a8,"SOCKS5");
              if (bVar2) {
                this->HTTPProxyType = 3;
              }
            }
          }
          std::__cxx11::string::~string((string *)local_2a8);
        }
        pcVar4 = getenv("HTTP_PROXY_USER");
        if (pcVar4 != (char *)0x0) {
          pcVar4 = getenv("HTTP_PROXY_USER");
          std::__cxx11::string::operator=((string *)&this->HTTPProxyAuth,pcVar4);
        }
        pcVar4 = getenv("HTTP_PROXY_PASSWD");
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::operator+=((string *)&this->HTTPProxyAuth,":");
          pcVar4 = getenv("HTTP_PROXY_PASSWD");
          std::__cxx11::string::operator+=((string *)&this->HTTPProxyAuth,pcVar4);
        }
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
        poVar5 = std::operator<<((ostream *)local_428,"   Use HTTP Proxy: ");
        poVar5 = std::operator<<(poVar5,(string *)&this->HTTPProxy);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x30c,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&ofs.field_0x260);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
      }
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,None);
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"Submit",
                 (cmGeneratedFileStream *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&prefix.field_2 + 8));
      GetSubmitResultsPrefix_abi_cxx11_((string *)local_6e8,this);
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->Files);
      if (!bVar2) {
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&prefix.field_2 + 8),&this->Files);
      }
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_708,"Update.xml",&local_709);
      cmCTest::AddIfExists(pcVar1,PartUpdate,&local_708);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator(&local_709);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_730,"Configure.xml",&local_731);
      cmCTest::AddIfExists(pcVar1,PartConfigure,&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator(&local_731);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"Build.xml",&local_759);
      cmCTest::AddIfExists(pcVar1,PartBuild,&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::allocator<char>::~allocator(&local_759);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"Test.xml",&local_781)
      ;
      cmCTest::AddIfExists(pcVar1,PartTest,&local_780);
      std::__cxx11::string::~string((string *)&local_780);
      std::allocator<char>::~allocator(&local_781);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,"Coverage.xml",
                 (allocator<char> *)
                 ((long)&gfiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar2 = cmCTest::AddIfExists(pcVar1,PartCoverage,&local_7a8);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&gfiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&gpath.field_2 + 8));
        std::operator+(&local_808,local_90,"/Testing/");
        cmCTest::GetCurrentTag_abi_cxx11_((string *)&glen,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7e8,&local_808,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&glen);
        std::__cxx11::string::~string((string *)&glen);
        std::__cxx11::string::~string((string *)&local_808);
        local_830 = std::__cxx11::string::size();
        local_830 = local_830 + 1;
        std::operator+(&local_850,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7e8,"/CoverageLog*");
        std::__cxx11::string::operator=((string *)local_7e8,(string *)&local_850);
        std::__cxx11::string::~string((string *)&local_850);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9c8);
        poVar5 = std::operator<<((ostream *)local_9c8,"Globbing for: ");
        poVar5 = std::operator<<(poVar5,(string *)local_7e8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x32a,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range3);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9c8);
        bVar2 = cmSystemTools::SimpleGlob
                          ((string *)local_7e8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&gpath.field_2 + 8),1);
        if (bVar2) {
          pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&gpath.field_2 + 8);
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar6);
          gfile = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pvVar6);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&gfile), bVar2) {
            local_a08 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end3);
            std::__cxx11::string::substr((ulong)local_a28,(ulong)local_a08);
            std::__cxx11::string::operator=((string *)local_a08,local_a28);
            std::__cxx11::string::~string(local_a28);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ba0);
            poVar5 = std::operator<<((ostream *)local_ba0,"Glob file: ");
            poVar5 = std::operator<<(poVar5,(string *)local_a08);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x32f,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string(local_bc0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ba0);
            cmCTest::AddSubmitFile((this->super_cmCTestGenericHandler).CTest,PartCoverage,local_a08)
            ;
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d38);
          poVar5 = std::operator<<((ostream *)local_d38,"Problem globbing");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x333,pcVar4,false);
          std::__cxx11::string::~string(local_d58);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d38);
        }
        std::__cxx11::string::~string((string *)local_7e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&gpath.field_2 + 8));
      }
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d78,"DynamicAnalysis.xml",&local_d79);
      cmCTest::AddIfExists(pcVar1,PartMemCheck,&local_d78);
      std::__cxx11::string::~string((string *)&local_d78);
      std::allocator<char>::~allocator(&local_d79);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_da0,"DynamicAnalysis-Test.xml",&local_da1);
      cmCTest::AddIfExists(pcVar1,PartMemCheck,&local_da0);
      std::__cxx11::string::~string((string *)&local_da0);
      std::allocator<char>::~allocator(&local_da1);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_dc8,"Purify.xml",&local_dc9);
      cmCTest::AddIfExists(pcVar1,PartMemCheck,&local_dc8);
      std::__cxx11::string::~string((string *)&local_dc8);
      std::allocator<char>::~allocator(&local_dc9);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_df0,"Notes.xml",&local_df1);
      cmCTest::AddIfExists(pcVar1,PartNotes,&local_df0);
      std::__cxx11::string::~string((string *)&local_df0);
      std::allocator<char>::~allocator(&local_df1);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p,"Upload.xml",(allocator<char> *)((long)&endPos + 7));
      cmCTest::AddIfExists(pcVar1,PartUpload,(string *)&p);
      std::__cxx11::string::~string((string *)&p);
      std::allocator<char>::~allocator((allocator<char> *)((long)&endPos + 7));
      for (endPos._0_4_ = PartStart; (Part)endPos != PartCount;
          endPos._0_4_ = (Part)endPos + PartUpdate) {
        if ((this->SubmitPart[(Part)endPos] & 1U) != 0) {
          pvVar6 = cmCTest::GetSubmitFiles_abi_cxx11_
                             ((this->super_cmCTestGenericHandler).CTest,(Part)endPos);
          ::cm::
          append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prefix.field_2 + 8),pvVar6);
        }
      }
      local_e30._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&prefix.field_2 + 8));
      pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(&prefix.field_2._M_allocated_capacity + 1);
      local_e38._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cbegin(pvVar6);
      local_e28 = __gnu_cxx::operator-(&local_e30,&local_e38);
      local_e50._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar6);
      local_e48 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&local_e50,local_e28);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_e40,&local_e48);
      local_e60._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(pvVar6);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_e58,&local_e60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(pvVar6,local_e40,local_e58);
      if ((this->SubmitPart[0xb] & 1U) != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[9]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (prefix.field_2._M_local_buf + 8),(char (*) [9])"Done.xml");
      }
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&files.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                files.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                _M_string_length));
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)
                                 &files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"Upload files:"
                                );
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        __range2._4_4_ = 0;
        pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&prefix.field_2 + 8);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar6);
        file = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar6);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&file), bVar2) {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (&files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,__range2._4_4_);
          poVar5 = std::operator<<(poVar5,"\t");
          poVar5 = std::operator<<(poVar5,(string *)pbVar7);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          __range2._4_4_ = __range2._4_4_ + 1;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1008);
      std::operator<<((ostream *)local_1008,"Submit files\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x35f,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)&specificGroup);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1008);
      pcVar4 = cmCTest::GetSpecificGroup((this->super_cmCTestGenericHandler).CTest);
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11a8);
        poVar5 = std::operator<<((ostream *)local_11a8,"   Send to group: ");
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x364,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(url.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11a8);
      }
      SetLogFile(this,(ostream *)
                      &files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCTest::GetSubmitURL_abi_cxx11_
                ((string *)local_11e8,(this->super_cmCTestGenericHandler).CTest);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1360);
      poVar5 = std::operator<<((ostream *)local_1360,"   SubmitURL: ");
      poVar5 = std::operator<<(poVar5,(string *)local_11e8);
      std::operator<<(poVar5,'\n');
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x36a,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_1380);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1360);
      std::operator+(&local_13c0,local_90,"/Testing/");
      cmCTest::GetCurrentTag_abi_cxx11_(&local_13e0,(this->super_cmCTestGenericHandler).CTest);
      std::operator+(&local_13a0,&local_13c0,&local_13e0);
      bVar2 = SubmitUsingHTTP(this,&local_13a0,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&prefix.field_2 + 8),(string *)local_6e8,
                              (string *)local_11e8);
      std::__cxx11::string::~string((string *)&local_13a0);
      std::__cxx11::string::~string((string *)&local_13e0);
      std::__cxx11::string::~string((string *)&local_13c0);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        if ((this->HasErrors & 1U) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1888);
          poVar5 = std::operator<<((ostream *)local_1888,"   Submission successful");
          pcVar4 = "";
          if ((this->HasWarnings & 1U) != 0) {
            pcVar4 = ", with warnings.";
          }
          poVar5 = std::operator<<(poVar5,pcVar4);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x37c,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_18a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1888);
          poVar5 = std::operator<<((ostream *)
                                   &files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   "   Submission successful");
          pcVar4 = "";
          if ((this->HasWarnings & 1U) != 0) {
            pcVar4 = ", with warnings.";
          }
          poVar5 = std::operator<<(poVar5,pcVar4);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16f0);
          std::operator<<((ostream *)local_16f0,"   Errors occurred during submission.\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x375,pcVar4,false);
          std::__cxx11::string::~string(local_1710);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16f0);
          std::operator<<((ostream *)
                          &files.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          "   Errors occurred during submission.\n");
        }
        this_local._4_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1558);
        std::operator<<((ostream *)local_1558,"   Problems when submitting via HTTP\n");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x36f,pcVar4,false);
        std::__cxx11::string::~string(local_1578);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1558);
        std::operator<<((ostream *)
                        &files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        "   Problems when submitting via HTTP\n");
        this_local._4_4_ = -1;
      }
      std::__cxx11::string::~string((string *)local_11e8);
      std::__cxx11::string::~string((string *)local_6e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&prefix.field_2 + 8));
      cmGeneratedFileStream::~cmGeneratedFileStream
                ((cmGeneratedFileStream *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
      poVar5 = std::operator<<((ostream *)local_250,
                               "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x2ea,pcVar4,false);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
      this_local._4_4_ = -1;
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestSubmitHandler::ProcessHandler()
{
  cmValue cdashUploadFile = this->GetOption("CDashUploadFile");
  cmValue cdashUploadType = this->GetOption("CDashUploadType");
  if (cdashUploadFile && cdashUploadType) {
    return this->HandleCDashUploadFile(*cdashUploadFile, *cdashUploadType);
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  if (char const* proxy = getenv("HTTP_PROXY")) {
    this->HTTPProxyType = 1;
    this->HTTPProxy = proxy;
    if (getenv("HTTP_PROXY_PORT")) {
      this->HTTPProxy += ":";
      this->HTTPProxy += getenv("HTTP_PROXY_PORT");
    }
    if (char const* proxy_type = getenv("HTTP_PROXY_TYPE")) {
      std::string type = proxy_type;
      // HTTP/SOCKS4/SOCKS5
      if (type == "HTTP") {
        this->HTTPProxyType = 1;
      } else if (type == "SOCKS4") {
        this->HTTPProxyType = 2;
      } else if (type == "SOCKS5") {
        this->HTTPProxyType = 3;
      }
    }
    if (getenv("HTTP_PROXY_USER")) {
      this->HTTPProxyAuth = getenv("HTTP_PROXY_USER");
    }
    if (getenv("HTTP_PROXY_PASSWD")) {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += getenv("HTTP_PROXY_PASSWD");
    }
  }

  if (!this->HTTPProxy.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Use HTTP Proxy: " << this->HTTPProxy << std::endl,
                       this->Quiet);
  }
  cmGeneratedFileStream ofs;
  this->StartLogFile("Submit", ofs);

  std::vector<std::string> files;
  std::string prefix = this->GetSubmitResultsPrefix();

  if (!this->Files.empty()) {
    // Submit the explicitly selected files:
    cm::append(files, this->Files);
  }

  // Add to the list of files to submit from any selected, existing parts:
  //

  // TODO:
  // Check if test is enabled

  this->CTest->AddIfExists(cmCTest::PartUpdate, "Update.xml");
  this->CTest->AddIfExists(cmCTest::PartConfigure, "Configure.xml");
  this->CTest->AddIfExists(cmCTest::PartBuild, "Build.xml");
  this->CTest->AddIfExists(cmCTest::PartTest, "Test.xml");
  if (this->CTest->AddIfExists(cmCTest::PartCoverage, "Coverage.xml")) {
    std::vector<std::string> gfiles;
    std::string gpath =
      buildDirectory + "/Testing/" + this->CTest->GetCurrentTag();
    std::string::size_type glen = gpath.size() + 1;
    gpath = gpath + "/CoverageLog*";
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Globbing for: " << gpath << std::endl, this->Quiet);
    if (cmSystemTools::SimpleGlob(gpath, gfiles, 1)) {
      for (std::string& gfile : gfiles) {
        gfile = gfile.substr(glen);
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "Glob file: " << gfile << std::endl, this->Quiet);
        this->CTest->AddSubmitFile(cmCTest::PartCoverage, gfile);
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Problem globbing" << std::endl);
    }
  }
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "DynamicAnalysis.xml");
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "DynamicAnalysis-Test.xml");
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "Purify.xml");
  this->CTest->AddIfExists(cmCTest::PartNotes, "Notes.xml");
  this->CTest->AddIfExists(cmCTest::PartUpload, "Upload.xml");

  // Query parts for files to submit.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = static_cast<cmCTest::Part>(p + 1)) {
    // Skip parts we are not submitting.
    if (!this->SubmitPart[p]) {
      continue;
    }

    // Submit files from this part.
    cm::append(files, this->CTest->GetSubmitFiles(p));
  }

  // Make sure files are unique, but preserve order.
  {
    // This endPos intermediate is needed to work around non-conformant C++11
    // standard libraries that have erase(iterator,iterator) instead of
    // erase(const_iterator,const_iterator).
    size_t endPos = cmRemoveDuplicates(files) - files.cbegin();
    files.erase(files.begin() + endPos, files.end());
  }

  // Submit Done.xml last
  if (this->SubmitPart[cmCTest::PartDone]) {
    files.emplace_back("Done.xml");
  }

  if (ofs) {
    ofs << "Upload files:" << std::endl;
    int cnt = 0;
    for (std::string const& file : files) {
      ofs << cnt << "\t" << file << std::endl;
      cnt++;
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Submit files\n",
                     this->Quiet);
  const char* specificGroup = this->CTest->GetSpecificGroup();
  if (specificGroup) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Send to group: " << specificGroup << std::endl,
                       this->Quiet);
  }
  this->SetLogFile(&ofs);

  std::string url = this->CTest->GetSubmitURL();
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   SubmitURL: " << url << '\n', this->Quiet);
  if (!this->SubmitUsingHTTP(buildDirectory + "/Testing/" +
                               this->CTest->GetCurrentTag(),
                             files, prefix, url)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "   Problems when submitting via HTTP\n");
    ofs << "   Problems when submitting via HTTP\n";
    return -1;
  }
  if (this->HasErrors) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Errors occurred during submission.\n");
    ofs << "   Errors occurred during submission.\n";
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Submission successful"
                         << (this->HasWarnings ? ", with warnings." : "")
                         << std::endl,
                       this->Quiet);
    ofs << "   Submission successful"
        << (this->HasWarnings ? ", with warnings." : "") << std::endl;
  }

  return 0;
}